

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintString
          (string *__return_storage_ptr__,FieldValuePrinter *this,string *val)

{
  string *in_RCX;
  StringPiece src;
  allocator local_21;
  StringPiece local_20;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",&local_21);
  StringPiece::StringPiece<std::allocator<char>>(&local_20,val);
  src.length_ = (stringpiece_ssize_type)__return_storage_ptr__;
  src.ptr_ = (char *)local_20.length_;
  CEscapeAndAppend((protobuf *)local_20.ptr_,src,in_RCX);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintString(const string& val) const {
  string printed("\"");
  CEscapeAndAppend(val, &printed);
  printed.push_back('\"');
  return printed;
}